

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall pbrt::Material::readFrom(Material *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *in_RDX;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  BinaryReader::read(binary,(int)&local_38,in_RDX,in_RCX);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

void Material::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();
    /*! \todo serialize materials (can only do once mateirals are fleshed out) */
  }